

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O3

bool __thiscall re2::PCRE::CheckRewriteString(PCRE *this,StringPiece *rewrite,string *error)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  uint uVar5;
  
  bVar3 = true;
  if (0 < (long)rewrite->length_) {
    pcVar4 = rewrite->ptr_;
    pcVar2 = pcVar4 + rewrite->length_;
    uVar1 = 0xffffffff;
    do {
      if (*pcVar4 == '\\') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == pcVar2) {
          pcVar4 = (char *)error->_M_string_length;
          pcVar2 = "Rewrite schema error: \'\\\' not allowed at end.";
LAB_00120dcd:
          std::__cxx11::string::_M_replace((ulong)error,0,pcVar4,(ulong)pcVar2);
          return false;
        }
        if (*pcVar4 != 0x5c) {
          uVar5 = (int)*pcVar4 - 0x30;
          if (9 < uVar5) {
            pcVar4 = (char *)error->_M_string_length;
            pcVar2 = "Rewrite schema error: \'\\\' must be followed by a digit or \'\\\'.";
            goto LAB_00120dcd;
          }
          if ((int)uVar1 <= (int)uVar5) {
            uVar1 = uVar5;
          }
        }
      }
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 < pcVar2);
    if (-1 < (int)uVar1) {
      bVar3 = false;
      SStringPrintf(error,
                    "Rewrite schema requests %d matches, but the regexp only has %d parenthesized subexpressions."
                    ,(ulong)uVar1,0xffffffff);
    }
  }
  return bVar3;
}

Assistant:

int pcre_exec(const pcre*, const pcre_extra*, const char*, int, int, int, int*, int) {
  return 0;
}